

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

void xmlLoadCatalogs(char *pathss)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  xmlChar *filename;
  long lVar4;
  
  if (pathss != (char *)0x0) {
    bVar2 = *pathss;
    while (bVar2 != 0) {
      for (; uVar3 = (ulong)(byte)*pathss, uVar3 < 0x21; pathss = (char *)((byte *)pathss + 1)) {
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
          if (uVar3 == 0) goto LAB_00165550;
          break;
        }
      }
      lVar4 = 0;
      while ((0x3a < (ulong)((byte *)pathss)[lVar4] ||
             ((0x400000100002601U >> ((ulong)((byte *)pathss)[lVar4] & 0x3f) & 1) == 0))) {
        lVar4 = lVar4 + 1;
      }
      filename = xmlStrndup((xmlChar *)pathss,(int)lVar4);
      pathss = (char *)((byte *)pathss + lVar4);
      if (filename != (xmlChar *)0x0) {
        xmlLoadCatalog((char *)filename);
        (*xmlFree)(filename);
      }
LAB_00165550:
      pathss = (char *)((byte *)pathss + -1);
      do {
        pbVar1 = (byte *)pathss + 1;
        pathss = (char *)((byte *)pathss + 1);
      } while (*pbVar1 == 0x3a);
      bVar2 = *pathss;
    }
  }
  return;
}

Assistant:

void
xmlLoadCatalogs(const char *pathss) {
    const char *cur;
    const char *paths;
    xmlChar *path;
#ifdef _WIN32
    int i, iLen;
#endif

    if (pathss == NULL)
	return;

    cur = pathss;
    while (*cur != 0) {
	while (xmlIsBlank_ch(*cur)) cur++;
	if (*cur != 0) {
	    paths = cur;
	    while ((*cur != 0) && (*cur != PATH_SEPARATOR) && (!xmlIsBlank_ch(*cur)))
		cur++;
	    path = xmlStrndup((const xmlChar *)paths, cur - paths);
	    if (path != NULL) {
#ifdef _WIN32
        iLen = strlen((const char*)path);
        for(i = 0; i < iLen; i++) {
            if(path[i] == '\\') {
                path[i] = '/';
            }
        }
#endif
		xmlLoadCatalog((const char *) path);
		xmlFree(path);
	    }
	}
	while (*cur == PATH_SEPARATOR)
	    cur++;
    }
}